

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int x509_name_oneline(X509_NAME *a,char *buf,size_t size)

{
  int iVar1;
  BIO_METHOD *type;
  ulong *puStack_38;
  int rc;
  BUF_MEM *biomem;
  BIO *bio_out;
  size_t size_local;
  char *buf_local;
  X509_NAME *a_local;
  
  bio_out = (BIO *)size;
  size_local = (size_t)buf;
  buf_local = (char *)a;
  type = BIO_s_mem();
  biomem = (BUF_MEM *)BIO_new(type);
  if ((BIO *)biomem == (BIO *)0x0) {
    a_local._4_4_ = 1;
  }
  else {
    iVar1 = X509_NAME_print_ex((BIO *)biomem,(X509_NAME *)buf_local,0,0x30000);
    BIO_ctrl((BIO *)biomem,0x73,0,&stack0xffffffffffffffc8);
    if ((BIO *)*puStack_38 < bio_out) {
      bio_out = (BIO *)*puStack_38;
    }
    else {
      bio_out = bio_out + -1;
    }
    memcpy((void *)size_local,(void *)puStack_38[1],(size_t)bio_out);
    bio_out[size_local] = (BIO)0x0;
    BIO_free((BIO *)biomem);
    a_local._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  }
  return a_local._4_4_;
}

Assistant:

static int x509_name_oneline(X509_NAME *a, char *buf, size_t size)
{
  BIO *bio_out = BIO_new(BIO_s_mem());
  BUF_MEM *biomem;
  int rc;

  if(!bio_out)
    return 1; /* alloc failed! */

  rc = X509_NAME_print_ex(bio_out, a, 0, XN_FLAG_SEP_SPLUS_SPC);
  BIO_get_mem_ptr(bio_out, &biomem);

  if((size_t)biomem->length < size)
    size = biomem->length;
  else
    size--; /* don't overwrite the buffer end */

  memcpy(buf, biomem->data, size);
  buf[size] = 0;

  BIO_free(bio_out);

  return !rc;
}